

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder.cc
# Opt level: O2

bool __thiscall draco::MeshEdgebreakerDecoder::InitializeDecoder(MeshEdgebreakerDecoder *this)

{
  MeshEdgebreakerDecoderImplInterface *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined8 in_RAX;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this_00;
  uint8_t traversal_decoder_type;
  uchar local_11;
  int iVar4;
  
  local_11 = (uchar)((ulong)in_RAX >> 0x38);
  bVar2 = DecoderBuffer::Decode<unsigned_char>
                    ((this->super_MeshDecoder).super_PointCloudDecoder.buffer_,&local_11);
  if (bVar2) {
    pMVar1 = (this->impl_)._M_t.
             super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
             .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>.
             _M_head_impl;
    (this->impl_)._M_t.
    super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
    .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl =
         (MeshEdgebreakerDecoderImplInterface *)0x0;
    if (pMVar1 != (MeshEdgebreakerDecoderImplInterface *)0x0) {
      (*pMVar1->_vptr_MeshEdgebreakerDecoderImplInterface[1])();
    }
    if (local_11 == '\x02') {
      this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                operator_new(0x350);
      MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
      MeshEdgebreakerDecoderImpl(this_00);
LAB_0012341f:
      pMVar1 = (this->impl_)._M_t.
               super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
               .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>.
               _M_head_impl;
      (this->impl_)._M_t.
      super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
      .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl =
           &this_00->super_MeshEdgebreakerDecoderImplInterface;
      if (pMVar1 != (MeshEdgebreakerDecoderImplInterface *)0x0) {
        (*pMVar1->_vptr_MeshEdgebreakerDecoderImplInterface[1])();
        goto LAB_00123432;
      }
    }
    else {
      if (local_11 == '\x01') {
        this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                  operator_new(0x330);
        MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
        MeshEdgebreakerDecoderImpl
                  ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *)
                   this_00);
        goto LAB_0012341f;
      }
      if (local_11 == '\0') {
        this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                  operator_new(0x2e8);
        MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
        MeshEdgebreakerDecoderImpl
                  ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)this_00);
        goto LAB_0012341f;
      }
LAB_00123432:
      this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                (this->impl_)._M_t.
                super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
                .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>.
                _M_head_impl;
      if (this_00 ==
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)0x0)
      goto LAB_00123449;
    }
    iVar4 = (*(this_00->super_MeshEdgebreakerDecoderImplInterface).
              _vptr_MeshEdgebreakerDecoderImplInterface[2])(this_00,this);
    uVar3 = (undefined1)iVar4;
  }
  else {
LAB_00123449:
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool MeshEdgebreakerDecoder::InitializeDecoder() {
  uint8_t traversal_decoder_type;
  if (!buffer()->Decode(&traversal_decoder_type)) {
    return false;
  }
  impl_ = nullptr;
  if (traversal_decoder_type == MESH_EDGEBREAKER_STANDARD_ENCODING) {
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<MeshEdgebreakerTraversalDecoder>());
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_PREDICTIVE_ENCODING) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalPredictiveDecoder>());
#endif
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalValenceDecoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}